

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv.h
# Opt level: O0

uv_os_fd_t uv_get_osfhandle(int fd)

{
  int fd_local;
  
  return fd;
}

Assistant:

static INLINE uv_os_fd_t uv_get_osfhandle(int fd) {
#ifdef _WIN32
  /*
   * _get_osfhandle() raises an assert in debug builds if the FD is invalid.
   * So if you plan on using invalid fd, you will need to install a _CrtSetReportHook handler
   */
  return (HANDLE) _get_osfhandle(fd);
#else
  return fd;
#endif
}